

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

int64_t __thiscall google::protobuf::io::StringOutputStream::ByteCount(StringOutputStream *this)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->target_ == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/zero_copy_stream_impl_lite.cc",
               0xb0);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: target_ != NULL: ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return this->target_->_M_string_length;
}

Assistant:

int64_t StringOutputStream::ByteCount() const {
  GOOGLE_CHECK(target_ != NULL);
  return target_->size();
}